

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::ErrorsTest::iterate(ErrorsTest *this)

{
  PFNGLCLEARNAMEDBUFFERDATA p_Var1;
  PFNGLCLEARNAMEDBUFFERSUBDATA p_Var2;
  PFNGLCOPYNAMEDBUFFERSUBDATA p_Var3;
  PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE p_Var4;
  PFNGLGETNAMEDBUFFERPARAMETERI64V p_Var5;
  PFNGLGETNAMEDBUFFERPARAMETERIV p_Var6;
  PFNGLGETNAMEDBUFFERPOINTERV p_Var7;
  PFNGLGETNAMEDBUFFERSUBDATA p_Var8;
  PFNGLMAPNAMEDBUFFER p_Var9;
  PFNGLMAPNAMEDBUFFERRANGE p_Var10;
  PFNGLNAMEDBUFFERDATA p_Var11;
  PFNGLNAMEDBUFFERSTORAGE p_Var12;
  PFNGLNAMEDBUFFERSUBDATA p_Var13;
  PFNGLUNMAPNAMEDBUFFER p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  int iVar29;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar31;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar30;
  
  iVar29 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar30 = CONCAT44(extraout_var,iVar29);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar15 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar16 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access"
                     );
  if ((bVar15) || (bVar16)) {
    p_Var1 = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar30 + 0x1d8);
    this->m_pClearNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar30 + 0x1e0);
    this->m_pClearNamedBufferSubData = p_Var2;
    p_Var3 = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar30 + 0x340);
    this->m_pCopyNamedBufferSubData = p_Var3;
    p_Var4 = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar30 + 0x660);
    this->m_pFlushMappedNamedBufferRange = p_Var4;
    p_Var5 = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lVar30 + 0x8f0);
    this->m_pGetNamedBufferParameteri64v = p_Var5;
    p_Var6 = *(PFNGLGETNAMEDBUFFERPARAMETERIV *)(lVar30 + 0x8f8);
    this->m_pGetNamedBufferParameteriv = p_Var6;
    p_Var7 = *(PFNGLGETNAMEDBUFFERPOINTERV *)(lVar30 + 0x900);
    this->m_pGetNamedBufferPointerv = p_Var7;
    p_Var8 = *(PFNGLGETNAMEDBUFFERSUBDATA *)(lVar30 + 0x908);
    this->m_pGetNamedBufferSubData = p_Var8;
    p_Var9 = *(PFNGLMAPNAMEDBUFFER *)(lVar30 + 0xd08);
    this->m_pMapNamedBuffer = p_Var9;
    p_Var10 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar30 + 0xd10);
    this->m_pMapNamedBufferRange = p_Var10;
    p_Var11 = *(PFNGLNAMEDBUFFERDATA *)(lVar30 + 0xec0);
    this->m_pNamedBufferData = p_Var11;
    p_Var12 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar30 + 0xed8);
    this->m_pNamedBufferStorage = p_Var12;
    p_Var13 = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar30 + 0xee0);
    this->m_pNamedBufferSubData = p_Var13;
    p_Var14 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar30 + 0x1678);
    this->m_pUnmapNamedBuffer = p_Var14;
    if (((p_Var1 == (PFNGLCLEARNAMEDBUFFERDATA)0x0) ||
        (((p_Var2 == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0 ||
          (p_Var3 == (PFNGLCOPYNAMEDBUFFERSUBDATA)0x0)) ||
         (p_Var4 == (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)0x0)))) ||
       ((((p_Var5 == (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0 ||
          (p_Var6 == (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0)) ||
         (p_Var7 == (PFNGLGETNAMEDBUFFERPOINTERV)0x0)) ||
        (((p_Var8 == (PFNGLGETNAMEDBUFFERSUBDATA)0x0 || (p_Var9 == (PFNGLMAPNAMEDBUFFER)0x0)) ||
         (((p_Var10 == (PFNGLMAPNAMEDBUFFERRANGE)0x0 ||
           (((p_Var11 == (PFNGLNAMEDBUFFERDATA)0x0 || (p_Var12 == (PFNGLNAMEDBUFFERSTORAGE)0x0)) ||
            (p_Var13 == (PFNGLNAMEDBUFFERSUBDATA)0x0)))) || (p_Var14 == (PFNGLUNMAPNAMEDBUFFER)0x0))
         )))))) {
      puVar31 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar31 = 0;
      __cxa_throw(puVar31,&int::typeinfo,0);
    }
    bVar15 = TestErrorsOfClearNamedBufferData(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar16 = TestErrorsOfClearNamedBufferSubData(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar17 = TestErrorsOfCopyNamedBufferSubData(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar18 = TestErrorsOfCreateBuffers(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar19 = TestErrorsOfFlushMappedNamedBufferRange(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar20 = TestErrorsOfGetNamedBufferParameter(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar21 = TestErrorsOfGetNamedBufferPointerv(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar22 = TestErrorsOfGetNamedBufferSubData(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar23 = TestErrorsOfMapNamedBuffer(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar24 = TestErrorsOfMapNamedBufferRange(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar25 = TestErrorsOfNamedBufferData(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar26 = TestErrorsOfNamedBufferStorage(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar27 = TestErrorsOfNamedBufferSubData(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    bVar28 = TestErrorsOfUnmapNamedBuffer(this);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    do {
      iVar29 = (**(code **)(lVar30 + 0x800))();
    } while (iVar29 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((((((((((bVar15 && bVar16) && bVar17) && bVar18) && bVar19) && bVar20) && bVar21) &&
             bVar22) && bVar23) && bVar24) && bVar25) && bVar26) && bVar27) && bVar28) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* API function pointers setup. */
	m_pClearNamedBufferData		   = (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData	 = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;
	m_pCopyNamedBufferSubData	  = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;
	m_pGetNamedBufferSubData	   = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;
	m_pMapNamedBuffer			   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pNamedBufferSubData		   = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		/* API function pointers check. */
		if ((DE_NULL == m_pClearNamedBufferData) || (DE_NULL == m_pClearNamedBufferSubData) ||
			(DE_NULL == m_pCopyNamedBufferSubData) || (DE_NULL == m_pFlushMappedNamedBufferRange) ||
			(DE_NULL == m_pGetNamedBufferParameteri64v) || (DE_NULL == m_pGetNamedBufferParameteriv) ||
			(DE_NULL == m_pGetNamedBufferPointerv) || (DE_NULL == m_pGetNamedBufferSubData) ||
			(DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pMapNamedBufferRange) || (DE_NULL == m_pNamedBufferData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Running test cases.                              Cleaning errors. */
		is_ok &= TestErrorsOfClearNamedBufferData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfClearNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfCopyNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfCreateBuffers();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfFlushMappedNamedBufferRange();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferParameter();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferPointerv();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfMapNamedBuffer();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfMapNamedBufferRange();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferStorage();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfUnmapNamedBuffer();
		while (gl.getError())
			;
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}